

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5NewTokenizerModule
              (Fts5Global *pGlobal,char *zName,void *pUserData,_func_void_void_ptr *xDestroy,
              Fts5TokenizerModule **ppNew)

{
  long lVar1;
  size_t sVar2;
  undefined8 *puVar3;
  undefined8 in_RCX;
  undefined8 in_RDX;
  char *in_RSI;
  long in_RDI;
  undefined8 *in_R8;
  long in_FS_OFFSET;
  sqlite3_int64 nByte;
  sqlite3_int64 nName;
  Fts5TokenizerModule *pNew;
  int rc;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  sVar2 = strlen(in_RSI);
  puVar3 = (undefined8 *)
           sqlite3Fts5MallocZero
                     ((int *)(sVar2 + 0x61),
                      CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  *in_R8 = puVar3;
  if (puVar3 != (undefined8 *)0x0) {
    *puVar3 = puVar3 + 0xc;
    memcpy((void *)*puVar3,in_RSI,sVar2 + 1);
    puVar3[1] = in_RDX;
    puVar3[10] = in_RCX;
    puVar3[0xb] = *(undefined8 *)(in_RDI + 0x48);
    *(undefined8 **)(in_RDI + 0x48) = puVar3;
    if (puVar3[0xb] == 0) {
      *(undefined8 **)(in_RDI + 0x50) = puVar3;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return 0;
}

Assistant:

static int fts5NewTokenizerModule(
  Fts5Global *pGlobal,            /* Global context (one per db handle) */
  const char *zName,              /* Name of new function */
  void *pUserData,                /* User data for aux. function */
  void(*xDestroy)(void*),         /* Destructor for pUserData */
  Fts5TokenizerModule **ppNew
){
  int rc = SQLITE_OK;
  Fts5TokenizerModule *pNew;
  sqlite3_int64 nName;          /* Size of zName and its \0 terminator */
  sqlite3_int64 nByte;          /* Bytes of space to allocate */

  nName = strlen(zName) + 1;
  nByte = sizeof(Fts5TokenizerModule) + nName;
  *ppNew = pNew = (Fts5TokenizerModule*)sqlite3Fts5MallocZero(&rc, nByte);
  if( pNew ){
    pNew->zName = (char*)&pNew[1];
    memcpy(pNew->zName, zName, nName);
    pNew->pUserData = pUserData;
    pNew->xDestroy = xDestroy;
    pNew->pNext = pGlobal->pTok;
    pGlobal->pTok = pNew;
    if( pNew->pNext==0 ){
      pGlobal->pDfltTok = pNew;
    }
  }

  return rc;
}